

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

bool dirichlet_mix_check(int comp_num,int elem_num,double *a,double *comp_weight)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  
  if (0 < comp_num) {
    uVar5 = 0;
    do {
      if (0 < elem_num) {
        uVar6 = 0;
        do {
          if (a[uVar6] <= 0.0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," \n",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"DIRICHLET_MIX_CHECK - Warning!\n",0x1f);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"  A(ELEM,COMP) <= 0.\n",0x15);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  COMP = ",9);
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)uVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  ELEM = ",9);
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)uVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"  A(COMP,ELEM) = ",0x11);
            dVar7 = a[uVar6];
            goto LAB_0019981d;
          }
          uVar6 = uVar6 + 1;
        } while ((uint)elem_num != uVar6);
      }
      uVar5 = uVar5 + 1;
      a = a + (uint)elem_num;
    } while (uVar5 != (uint)comp_num);
  }
  if (0 < comp_num) {
    uVar5 = 0;
    bVar1 = false;
    do {
      if (comp_weight[uVar5] < 0.0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," \n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"DIRICHLET_MIX_CHECK - Warning!\n",0x1f);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"  COMP_WEIGHT(COMP) < 0.\n",0x19);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  COMP = ",9);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)uVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"  COMP_WEIGHT(COMP) = ",0x16);
        dVar7 = comp_weight[uVar5];
LAB_0019981d:
        poVar4 = std::ostream::_M_insert<double>(dVar7);
        lVar2 = 1;
        pcVar3 = "\n";
        goto LAB_0019982d;
      }
      if (0.0 < comp_weight[uVar5]) {
        bVar1 = true;
      }
      uVar5 = uVar5 + 1;
    } while ((uint)comp_num != uVar5);
    if (bVar1) {
      return true;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," \n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"DIRICHLET_MIX_CHECK - Warning!\n",0x1f);
  pcVar3 = "  All component weights are zero.\n";
  lVar2 = 0x22;
  poVar4 = (ostream *)&std::cerr;
LAB_0019982d:
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,lVar2);
  return false;
}

Assistant:

bool dirichlet_mix_check ( int comp_num, int elem_num, double a[],
  double comp_weight[] )

//****************************************************************************80
//
//  Purpose:
//
//    DIRICHLET_MIX_CHECK checks the parameters of a Dirichlet mixture PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    30 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int COMP_NUM, the number of components in the Dirichlet
//    mixture density, that is, the number of distinct Dirichlet PDF's
//    that are mixed together.
//
//    Input, int ELEM_NUM, the number of elements of an observation.
//
//    Input, double A[ELEM_NUM*COMP_NUM], the probabilities
//    for element ELEM_NUM in component COMP_NUM.
//    Each A[I,J] should be positive.
//
//    Input, double COMP_WEIGHT[COMP_NUM], the mixture weights of the densities.
//    These do not need to be normalized.  The weight of a given component is
//    the relative probability that that component will be used to generate
//    the sample.
//
//    Output, bool DIRICHLET_MIX_CHECK, is true if the parameters are legal.
//
{
  int comp_i;
  int elem_i;
  bool positive;

  for ( comp_i = 0; comp_i < comp_num; comp_i++ )
  {
    for ( elem_i = 0; elem_i < elem_num; elem_i++ )
    {
      if ( a[elem_i+comp_i*elem_num] <= 0.0 )
      {
        cerr << " \n";
        cerr << "DIRICHLET_MIX_CHECK - Warning!\n";
        cerr << "  A(ELEM,COMP) <= 0.\n";
        cerr << "  COMP = " << comp_i << "\n";
        cerr << "  ELEM = " << elem_i << "\n";
        cerr << "  A(COMP,ELEM) = " << a[elem_i+comp_i*elem_num] << "\n";
        return false;
      }
    }
  }

  positive = false;

  for ( comp_i = 0; comp_i < comp_num; comp_i++ )
  {
    if ( comp_weight[comp_i] < 0.0 )
    {
      cerr << " \n";
      cerr << "DIRICHLET_MIX_CHECK - Warning!\n";
      cerr << "  COMP_WEIGHT(COMP) < 0.\n";
      cerr << "  COMP = " << comp_i << "\n";
      cerr << "  COMP_WEIGHT(COMP) = " << comp_weight[comp_i] << "\n";
      return false;
    }
    else if ( 0.0 < comp_weight[comp_i] )
    {
      positive = true;
    }
  }

  if ( !positive )
  {
    cerr << " \n";
    cerr << "DIRICHLET_MIX_CHECK - Warning!\n";
    cerr << "  All component weights are zero.\n";
    return false;
  }

  return true;
}